

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_parse(REF_DBL *metric,REF_GRID ref_grid,int narg,char **args)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uint uVar5;
  REF_NODE pRVar6;
  undefined8 uVar7;
  REF_DBL *pRVar8;
  char **ppcVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  REF_GRID pRVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  REF_DBL diag_system [12];
  REF_DBL geom [8];
  undefined4 local_168;
  undefined4 uStack_164;
  double local_140;
  double local_138;
  ulong uStack_130;
  long local_128;
  REF_GRID local_120;
  double local_118;
  ulong uStack_110;
  char **local_108;
  REF_DBL *local_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  REF_DBL local_78 [3];
  double local_60 [6];
  
  if (narg < 1) {
    return 0;
  }
  lVar11 = 0;
  ppcVar9 = args;
  local_120 = ref_grid;
  local_108 = args;
  local_100 = metric;
  do {
    iVar16 = (int)lVar11;
    iVar14 = iVar16 + 5;
    lVar11 = 0;
    while ((iVar3 = strncmp(args[iVar16 + lVar11],"--uniform",9), iVar3 != 0 ||
           (iVar3 = (int)lVar11, narg <= iVar3 + iVar16 + 1))) {
LAB_001bbc1d:
      lVar11 = lVar11 + 1;
      iVar14 = iVar14 + 1;
      if (narg <= (int)lVar11 + iVar16) {
        return 0;
      }
    }
    pcVar10 = ppcVar9[(iVar16 + 1) + lVar11];
    iVar4 = strncmp(pcVar10,"box",3);
    if (iVar4 == 0) {
      if (narg <= iVar3 + iVar16 + 10) {
        pcVar10 = 
        "not enough arguments for\n  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin xmax ymax zmax"
        ;
        uVar7 = 0xd16;
        goto LAB_001bc4d9;
      }
      pcVar10 = args[(long)iVar16 + lVar11 + 2];
      iVar3 = strncmp(pcVar10,"ceil",4);
      local_e8 = (double)CONCAT44(local_e8._4_4_,iVar3);
      if ((iVar3 != 0) && (iVar3 = strncmp(pcVar10,"floor",5), iVar3 != 0)) {
        pcVar10 = 
        "ceil or floor is missing\n  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin xmax ymax zmax"
        ;
        uVar7 = 0xd1b;
        goto LAB_001bc4d9;
      }
      dVar25 = atof(args[(long)iVar16 + lVar11 + 3]);
      dVar23 = atof(args[(long)iVar16 + lVar11 + 4]);
      ppcVar9 = local_108;
      local_138 = -dVar25;
      uStack_130 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) ^ 0x8000000000000000;
      lVar12 = (long)iVar14;
      lVar11 = 0;
      do {
        dVar24 = atof(ppcVar9[lVar12 + lVar11]);
        pRVar13 = local_120;
        local_78[lVar11] = dVar24;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 6);
      local_118 = (double)(~-(ulong)(0.0 < dVar25) & (ulong)local_138 |
                          -(ulong)(0.0 < dVar25) & (ulong)dVar25);
      uStack_110 = uStack_130;
      iVar14 = local_120->mpi->id;
      if (local_e8._0_4_ == 0) {
        if (iVar14 == 0) {
          pcVar10 = "--uniform box ceil h0=%f decay=%f [%f %f %f %f %f %f]\n";
          goto LAB_001bc135;
        }
      }
      else if (iVar14 == 0) {
        pcVar10 = "--uniform box floor h0=%f decay=%f [%f %f %f %f %f %f]\n";
LAB_001bc135:
        printf(pcVar10,local_118._0_4_,dVar23,SUB84(local_78[0],0),local_78[1],local_78[2],
               local_60[0],local_60[1],local_60[2]);
      }
      local_168 = SUB84(local_140,0);
      uStack_164 = (undefined4)((ulong)local_140 >> 0x20);
      pRVar6 = pRVar13->node;
      local_128 = lVar12;
      if (0 < pRVar6->max) {
        local_f8 = dVar23 * 1e+20;
        dVar25 = (double)((ulong)local_f8 ^ (ulong)DAT_00218050);
        if (local_f8 <= dVar25) {
          local_f8 = dVar25;
        }
        uStack_f0 = 0;
        lVar12 = 0;
        lVar11 = 0;
        do {
          if (-1 < pRVar6->global[lVar11]) {
            uVar19 = 0;
            uVar20 = 0;
            uVar21 = 0;
            uVar22 = 0;
            lVar15 = 0;
            do {
              dVar25 = *(double *)((long)pRVar6->real + lVar15 * 8 + lVar12);
              dVar29 = dVar25 - local_60[lVar15];
              uVar17 = -(ulong)(local_60[lVar15] < dVar25);
              dVar24 = dVar25 - local_78[lVar15];
              uVar18 = -(ulong)(dVar25 < local_78[lVar15]);
              auVar28._0_8_ = ~uVar18 & CONCAT44(uVar20,uVar19);
              auVar28._12_4_ = uVar22;
              auVar28._8_4_ = uVar21;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = (ulong)(dVar24 * dVar24 + (double)CONCAT44(uVar20,uVar19)) & uVar18;
              auVar28 = auVar28 | auVar2;
              auVar27._0_8_ = uVar17 & (ulong)(dVar29 * dVar29 + auVar28._0_8_);
              auVar27._8_8_ = 0;
              auVar1._8_4_ = auVar28._8_4_;
              auVar1._0_8_ = ~uVar17 & (ulong)auVar28._0_8_;
              auVar1._12_4_ = auVar28._12_4_;
              auVar27 = auVar27 | auVar1;
              dVar25 = auVar27._0_8_;
              uVar19 = auVar27._0_4_;
              uVar20 = auVar27._4_4_;
              uVar21 = auVar27._8_4_;
              uVar22 = auVar27._12_4_;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            if (dVar25 < 0.0) {
              dVar25 = sqrt(dVar25);
            }
            else {
              dVar25 = SQRT(dVar25);
            }
            dVar24 = -dVar25;
            dVar29 = dVar24;
            if (dVar24 <= dVar25) {
              dVar29 = dVar25;
            }
            dVar26 = local_118;
            if (dVar29 < local_f8) {
              dVar26 = exp2(dVar24 / dVar23);
              dVar26 = dVar26 * local_118;
            }
            pRVar8 = local_100 + lVar11 * 6;
            local_138 = dVar26;
            uVar5 = ref_matrix_diag_m(pRVar8,&local_d8);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xd3b,"ref_metric_parse",(ulong)uVar5,"decomp");
              return uVar5;
            }
            dVar24 = 1.0 / (local_138 * local_138);
            if (local_e8._0_4_ == 0) {
              dVar29 = dVar24;
              if (dVar24 <= local_d8) {
                dVar29 = local_d8;
              }
              dVar26 = dVar24;
              if (dVar24 <= local_d0) {
                dVar26 = local_d0;
              }
              local_d8 = dVar29;
              local_d0 = dVar26;
              if (dVar24 <= local_c8) {
                dVar24 = local_c8;
              }
            }
            else {
              dVar29 = dVar24;
              if (local_d8 <= dVar24) {
                dVar29 = local_d8;
              }
              dVar26 = dVar24;
              if (local_d0 <= dVar24) {
                dVar26 = local_d0;
              }
              local_d8 = dVar29;
              local_d0 = dVar26;
              if (local_c8 <= dVar24) {
                dVar24 = local_c8;
              }
            }
            local_c8 = dVar24;
            uVar5 = ref_matrix_form_m(&local_d8,pRVar8);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xd4b,"ref_metric_parse",(ulong)uVar5,"reform");
              return uVar5;
            }
            local_168 = SUB84(dVar25,0);
            uStack_164 = (undefined4)((ulong)dVar25 >> 0x20);
            pRVar13 = local_120;
            if (local_120->twod != 0) {
              pRVar8[2] = 0.0;
              pRVar8[4] = 0.0;
              pRVar8[5] = 1.0;
            }
          }
          lVar11 = lVar11 + 1;
          pRVar6 = pRVar13->node;
          lVar12 = lVar12 + 0x78;
        } while (lVar11 < pRVar6->max);
      }
      local_140 = (double)CONCAT44(uStack_164,local_168);
      lVar11 = local_128 + 6;
    }
    else {
      iVar4 = strncmp(pcVar10,"cyl",3);
      if (iVar4 != 0) goto LAB_001bbc1d;
      if (narg <= iVar3 + iVar16 + 0xc) {
        pcVar10 = 
        "not enough arguments for\n  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 x2 y2 z2 r1 r2"
        ;
        uVar7 = 0xd59;
LAB_001bc4d9:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar7,"ref_metric_parse",pcVar10);
        return 1;
      }
      pcVar10 = args[(long)iVar16 + lVar11 + 2];
      iVar3 = strncmp(pcVar10,"ceil",4);
      local_118 = (double)CONCAT44(local_118._4_4_,iVar3);
      if ((iVar3 != 0) && (iVar3 = strncmp(pcVar10,"floor",5), iVar3 != 0)) {
        pcVar10 = 
        "ceil or floor is missing\n  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 x2 y2 z2 r1 r2"
        ;
        uVar7 = 0xd5e;
        goto LAB_001bc4d9;
      }
      dVar25 = atof(args[(long)iVar16 + lVar11 + 3]);
      local_f8 = atof(args[(long)iVar16 + lVar11 + 4]);
      ppcVar9 = local_108;
      local_138 = -dVar25;
      uStack_130 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00) ^ 0x8000000000000000;
      lVar11 = 0;
      do {
        dVar23 = atof(ppcVar9[iVar14 + lVar11]);
        pRVar13 = local_120;
        local_78[lVar11] = dVar23;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 8);
      pRVar6 = local_120->node;
      lVar11 = (long)iVar14 + 8;
      if (0 < pRVar6->max) {
        local_138 = (double)(~-(ulong)(0.0 < dVar25) & (ulong)local_138 |
                            -(ulong)(0.0 < dVar25) & (ulong)dVar25);
        local_e8 = local_f8 * 1e+20;
        if (local_e8 <= -local_e8) {
          local_e8 = -local_e8;
        }
        uStack_e0 = 0;
        lVar15 = 0;
        lVar12 = 0;
        pRVar8 = local_100;
        local_128 = lVar11;
        do {
          if (-1 < pRVar6->global[lVar12]) {
            uVar5 = ref_metric_truncated_cone_dist
                              (local_78,(REF_DBL *)((long)pRVar6->real + lVar15),&local_140);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xd6d,"ref_metric_parse",(ulong)uVar5,"trunc cone dist");
              return uVar5;
            }
            dVar25 = -local_140;
            uVar19 = (undefined4)((ulong)dVar25 >> 0x20);
            if (dVar25 <= local_140) {
              uVar19 = (undefined4)((ulong)local_140 >> 0x20);
            }
            dVar23 = local_138;
            if ((double)CONCAT44(uVar19,SUB84(local_140,0)) <= local_e8 &&
                local_e8 != (double)CONCAT44(uVar19,SUB84(local_140,0))) {
              dVar23 = exp2(dVar25 / local_f8);
              dVar23 = dVar23 * local_138;
            }
            uVar5 = ref_matrix_diag_m(pRVar8,&local_d8);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xd72,"ref_metric_parse",(ulong)uVar5,"decomp");
              return uVar5;
            }
            dVar25 = 1.0 / (dVar23 * dVar23);
            if (local_118._0_4_ == 0) {
              dVar23 = dVar25;
              if (dVar25 <= local_d8) {
                dVar23 = local_d8;
              }
              dVar24 = dVar25;
              if (dVar25 <= local_d0) {
                dVar24 = local_d0;
              }
              local_d8 = dVar23;
              local_d0 = dVar24;
              if (dVar25 <= local_c8) {
                dVar25 = local_c8;
              }
            }
            else {
              dVar23 = dVar25;
              if (local_d8 <= dVar25) {
                dVar23 = local_d8;
              }
              dVar24 = dVar25;
              if (local_d0 <= dVar25) {
                dVar24 = local_d0;
              }
              local_d8 = dVar23;
              local_d0 = dVar24;
              if (local_c8 <= dVar25) {
                dVar25 = local_c8;
              }
            }
            local_c8 = dVar25;
            uVar5 = ref_matrix_form_m(&local_d8,pRVar8);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xd82,"ref_metric_parse",(ulong)uVar5,"reform");
              return uVar5;
            }
            if (pRVar13->twod != 0) {
              pRVar8[2] = 0.0;
              pRVar8[4] = 0.0;
              pRVar8[5] = 1.0;
            }
          }
          lVar12 = lVar12 + 1;
          pRVar6 = pRVar13->node;
          pRVar8 = pRVar8 + 6;
          lVar15 = lVar15 + 0x78;
          lVar11 = local_128;
        } while (lVar12 < pRVar6->max);
      }
    }
    if (narg <= (int)lVar11) {
      return 0;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_parse(REF_DBL *metric, REF_GRID ref_grid,
                                    int narg, char *args[]) {
  REF_INT i, node, pos;
  REF_DBL diag_system[12];
  REF_DBL h0, decay_distance;
  REF_DBL geom[8];
  REF_DBL r, h;
  REF_BOOL ceil;

  pos = 0;
  while (pos < narg) {
    if (strncmp(args[pos], "--uniform", 9) != 0) {
      pos++;
    } else {
      pos++;
      if (pos < narg && strncmp(args[pos], "box", 3) == 0) {
        pos++;
        RAS(pos + 8 < narg,
            "not enough arguments for\n"
            "  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin "
            "xmax ymax zmax");
        RAS(strncmp(args[pos], "ceil", 4) == 0 ||
                strncmp(args[pos], "floor", 5) == 0,
            "ceil or floor is missing\n"
            "  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin "
            "xmax ymax zmax");
        ceil = (strncmp(args[pos], "ceil", 4) == 0);
        pos++;
        h0 = atof(args[pos]);
        pos++;
        decay_distance = atof(args[pos]);
        pos++;
        h0 = ABS(h0); /* metric must be semi-positive definite */
        for (i = 0; i < 6; i++) {
          geom[i] = atof(args[pos]);
          pos++;
        }

        if (ceil) {
          if (ref_mpi_once(ref_grid_mpi(ref_grid)))
            printf("--uniform box ceil h0=%f decay=%f [%f %f %f %f %f %f]\n",
                   h0, decay_distance, geom[0], geom[1], geom[2], geom[3],
                   geom[4], geom[5]);
        } else {
          if (ref_mpi_once(ref_grid_mpi(ref_grid)))
            printf("--uniform box floor h0=%f decay=%f [%f %f %f %f %f %f]\n",
                   h0, decay_distance, geom[0], geom[1], geom[2], geom[3],
                   geom[4], geom[5]);
        }
        each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
          RSS(ref_metric_cart_box_dist(
                  geom, ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &r),
              "box dist");
          h = h0;
          if (ref_math_divisible(-r, decay_distance)) {
            h = h0 * pow(2, -r / decay_distance);
          }
          RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "decomp");
          if (ceil) {
            ref_matrix_eig(diag_system, 0) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          } else {
            ref_matrix_eig(diag_system, 0) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          }
          RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform");
          if (ref_grid_twod(ref_grid)) {
            metric[2 + 6 * node] = 0.0;
            metric[4 + 6 * node] = 0.0;
            metric[5 + 6 * node] = 1.0;
          }
        }
        continue;
      }
      if (pos < narg && strncmp(args[pos], "cyl", 3) == 0) {
        pos++;
        RAS(pos + 10 < narg,
            "not enough arguments for\n"
            "  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 "
            "x2 y2 z2 r1 r2");
        RAS(strncmp(args[pos], "ceil", 4) == 0 ||
                strncmp(args[pos], "floor", 5) == 0,
            "ceil or floor is missing\n"
            "  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 "
            "x2 y2 z2 r1 r2");
        ceil = (strncmp(args[pos], "ceil", 4) == 0);
        pos++;
        h0 = atof(args[pos]);
        pos++;
        decay_distance = atof(args[pos]);
        pos++;
        h0 = ABS(h0); /* metric must be semi-positive definite */
        for (i = 0; i < 8; i++) {
          geom[i] = atof(args[pos]);
          pos++;
        }
        each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
          RSS(ref_metric_truncated_cone_dist(
                  geom, ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &r),
              "trunc cone dist");
          h = h0;
          if (ref_math_divisible(-r, decay_distance)) {
            h = h0 * pow(2, -r / decay_distance);
          }
          RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "decomp");
          if (ceil) {
            ref_matrix_eig(diag_system, 0) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          } else {
            ref_matrix_eig(diag_system, 0) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          }
          RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform");
          if (ref_grid_twod(ref_grid)) {
            metric[2 + 6 * node] = 0.0;
            metric[4 + 6 * node] = 0.0;
            metric[5 + 6 * node] = 1.0;
          }
        }
        continue;
      }
    }
  }
  return REF_SUCCESS;
}